

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O0

void __thiscall
GlobOpt::UpdateIntBoundsForGreaterThanOrEqualBranch(GlobOpt *this,Value *src1Value,Value *src2Value)

{
  code *pcVar1;
  bool bVar2;
  ValueNumber VVar3;
  ValueNumber VVar4;
  int32 iVar5;
  int32 iVar6;
  int32 iVar7;
  int32 iVar8;
  undefined4 *puVar9;
  ValueInfo *pVVar10;
  PathDependentInfo local_60;
  PathDependentInfo local_48;
  IntConstantBounds local_30;
  IntConstantBounds src2ConstantBounds;
  IntConstantBounds src1ConstantBounds;
  Value *src2Value_local;
  Value *src1Value_local;
  GlobOpt *this_local;
  
  if (src1Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x10c,"(src1Value)","src1Value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (src2Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x10d,"(src2Value)","src2Value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar2 = DoPathDependentValues(this);
  if (bVar2) {
    VVar3 = ::Value::GetValueNumber(src1Value);
    VVar4 = ::Value::GetValueNumber(src2Value);
    if (VVar3 != VVar4) {
      bVar2 = IsLoopPrePass(this);
      if (((!bVar2) && (bVar2 = DoAggressiveIntTypeSpec(this), bVar2)) &&
         (bVar2 = DoConstFold(this), bVar2)) {
        IntConstantBounds::IntConstantBounds(&src2ConstantBounds);
        IntConstantBounds::IntConstantBounds(&local_30);
        pVVar10 = ::Value::GetValueInfo(src1Value);
        bVar2 = ValueInfo::TryGetIntConstantBounds(pVVar10,&src2ConstantBounds,true);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x118,
                             "(src1Value->GetValueInfo()->TryGetIntConstantBounds(&src1ConstantBounds, true))"
                             ,
                             "src1Value->GetValueInfo()->TryGetIntConstantBounds(&src1ConstantBounds, true)"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        pVVar10 = ::Value::GetValueInfo(src2Value);
        bVar2 = ValueInfo::TryGetIntConstantBounds(pVVar10,&local_30,true);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x119,
                             "(src2Value->GetValueInfo()->TryGetIntConstantBounds(&src2ConstantBounds, true))"
                             ,
                             "src2Value->GetValueInfo()->TryGetIntConstantBounds(&src2ConstantBounds, true)"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        iVar5 = IntConstantBounds::LowerBound(&src2ConstantBounds);
        iVar6 = IntConstantBounds::UpperBound(&src2ConstantBounds);
        iVar7 = IntConstantBounds::LowerBound(&local_30);
        iVar8 = IntConstantBounds::UpperBound(&local_30);
        bVar2 = ValueInfo::IsGreaterThanOrEqualTo(src1Value,iVar5,iVar6,src2Value,iVar7,iVar8);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x122,
                             "(!ValueInfo::IsGreaterThanOrEqualTo( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound()))"
                             ,
                             "!ValueInfo::IsGreaterThanOrEqualTo( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound())"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        iVar5 = IntConstantBounds::LowerBound(&src2ConstantBounds);
        iVar6 = IntConstantBounds::UpperBound(&src2ConstantBounds);
        iVar7 = IntConstantBounds::LowerBound(&local_30);
        iVar8 = IntConstantBounds::UpperBound(&local_30);
        bVar2 = ValueInfo::IsLessThan(src1Value,iVar5,iVar6,src2Value,iVar7,iVar8);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x12a,
                             "(!ValueInfo::IsLessThan( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound()))"
                             ,
                             "!ValueInfo::IsLessThan( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound())"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
      }
      PathDependentInfo::PathDependentInfo(&local_48,GreaterThanOrEqual,src1Value,src2Value);
      SetPathDependentInfo(this,true,&local_48);
      PathDependentInfo::PathDependentInfo(&local_60,LessThan,src1Value,src2Value);
      SetPathDependentInfo(this,false,&local_60);
    }
  }
  return;
}

Assistant:

void GlobOpt::UpdateIntBoundsForGreaterThanOrEqualBranch(Value *const src1Value, Value *const src2Value)
{
    Assert(src1Value);
    Assert(src2Value);

    if(!DoPathDependentValues() || src1Value->GetValueNumber() == src2Value->GetValueNumber())
    {
        return;
    }

#if DBG
    if(!IsLoopPrePass() && DoAggressiveIntTypeSpec() && DoConstFold())
    {
        IntConstantBounds src1ConstantBounds, src2ConstantBounds;
        AssertVerify(src1Value->GetValueInfo()->TryGetIntConstantBounds(&src1ConstantBounds, true));
        AssertVerify(src2Value->GetValueInfo()->TryGetIntConstantBounds(&src2ConstantBounds, true));

        Assert(
            !ValueInfo::IsGreaterThanOrEqualTo(
                src1Value,
                src1ConstantBounds.LowerBound(),
                src1ConstantBounds.UpperBound(),
                src2Value,
                src2ConstantBounds.LowerBound(),
                src2ConstantBounds.UpperBound()));
        Assert(
            !ValueInfo::IsLessThan(
                src1Value,
                src1ConstantBounds.LowerBound(),
                src1ConstantBounds.UpperBound(),
                src2Value,
                src2ConstantBounds.LowerBound(),
                src2ConstantBounds.UpperBound()));
    }
#endif

    SetPathDependentInfo(true, PathDependentInfo(PathDependentRelationship::GreaterThanOrEqual, src1Value, src2Value));
    SetPathDependentInfo(false, PathDependentInfo(PathDependentRelationship::LessThan, src1Value, src2Value));
}